

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_vector.hpp
# Opt level: O3

void __thiscall
poplar::compact_vector::compact_vector(compact_vector *this,uint64_t size,uint32_t width)

{
  undefined8 *puVar1;
  value_type local_18;
  
  (this->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->size_ = 0;
  this->mask_ = 0;
  this->width_ = 0;
  (this->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->size_ = 0;
  if (width < 0x40) {
    this->size_ = size;
    this->mask_ = ~(-1L << ((ulong)width & 0x3f));
    this->width_ = (ulong)width;
    local_18 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->chunks_,width * size + 0x3f >> 6,&local_18);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_0016cab0;
  puVar1[1] = 
  "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/compact_vector.hpp:39:width overflow."
  ;
  __cxa_throw(puVar1,&exception::typeinfo,std::exception::~exception);
}

Assistant:

compact_vector(uint64_t size, uint32_t width) {
        POPLAR_THROW_IF(64 <= width, "width overflow.");

        size_ = size;
        mask_ = (1ULL << width) - 1;
        width_ = width;
        chunks_.resize(bit_tools::words_for(size_ * width_), 0);
    }